

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int intGpioSetAlertFunc(uint gpio,void *f,int user,void *userdata)

{
  FILE *__stream;
  char *pcVar1;
  void *in_RCX;
  uint in_EDX;
  callbk_t in_RSI;
  uint in_EDI;
  
  __stream = _stderr;
  if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar1 = myTimeStamp();
    fprintf(__stream,"%s %s: gpio=%d function=%08X, user=%d, userdata=%08X\n",pcVar1,
            "intGpioSetAlertFunc",(ulong)in_EDI,(ulong)in_RSI & 0xffffffff,in_EDX,(int)in_RCX);
  }
  gpioAlert[in_EDI].ex = in_EDX;
  gpioAlert[in_EDI].userdata = in_RCX;
  gpioAlert[in_EDI].func = in_RSI;
  if (in_RSI == (callbk_t)0x0) {
    alertBits = alertBits & (1 << ((byte)in_EDI & 0x1f) ^ 0xffffffffU);
  }
  else {
    alertBits = alertBits | 1 << ((byte)in_EDI & 0x1f);
  }
  monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;
  return 0;
}

Assistant:

static int intGpioSetAlertFunc(
   unsigned gpio,
   void *   f,
   int      user,
   void *   userdata)
{
   DBG(DBG_INTERNAL, "gpio=%d function=%08X, user=%d, userdata=%08X",
      gpio, (uint32_t)f, user, (uint32_t)userdata);

   gpioAlert[gpio].ex = user;
   gpioAlert[gpio].userdata = userdata;

   gpioAlert[gpio].func = f;

   if (f)
   {
      alertBits |= BIT;
   }
   else
   {
      alertBits &= ~BIT;
   }

   monitorBits = alertBits | notifyBits | scriptBits | gpioGetSamples.bits;

   return 0;
}